

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  pointer pcVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  LinkClosure *pLVar7;
  ostream *poVar8;
  cmake *this_01;
  cmListFileBacktrace *r;
  string ll;
  string flagVar;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TVar2 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar2) {
    return false;
  }
  if (TVar2 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  this_00 = this->Makefile;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_SKIP_RPATH","");
  bVar4 = cmMakefile::IsOn(this_00,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar4) {
    return false;
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar4 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar4) {
    return false;
  }
  bVar4 = IsChrpathUsed(this,config);
  if (bVar4) {
    return false;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar3 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,pcVar3 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_200 != 0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_208);
    std::__cxx11::string::append(local_1a8);
    bVar4 = cmMakefile::IsSet(this->Makefile,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      bVar4 = HaveBuildTreeRPATH(this,config);
      bVar5 = true;
      if (!bVar4) {
        bVar5 = HaveInstallTreeRPATH(this);
      }
      (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1a8);
      iVar6 = std::__cxx11::string::compare(local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (bVar5 == true && iVar6 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The install of the ",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                   ,0xe1);
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        r = cmTarget::GetBacktrace(this->Target);
        cmListFileBacktrace::cmListFileBacktrace(&local_1c8,r);
        cmake::IssueMessage(this_01,FATAL_ERROR,&local_1e8,&local_1c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      goto LAB_0026ecf7;
    }
  }
  bVar5 = false;
LAB_0026ecf7:
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
    return bVar5;
  }
  return bVar5;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}